

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void highbd_blend_a64_d16_mask_w4_sse4_1
               (uint16_t *dst,int dst_stride,CONV_BUF_TYPE *src0,int src0_stride,CONV_BUF_TYPE *src1
               ,int src1_stride,__m128i *mask0a,__m128i *mask0b,__m128i *round_offset,int shift,
               __m128i *clip_low,__m128i *clip_high,__m128i *mask_max)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int in_ECX;
  void *in_RDX;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  int in_ESI;
  void *lo;
  void *in_RDI;
  void *in_R8;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  __m128i alVar31;
  __m128i v;
  __m128i v_00;
  __m128i v_01;
  __m128i clipb;
  __m128i clipa;
  __m128i packb;
  __m128i packa;
  __m128i roundbl;
  __m128i roundal;
  __m128i roundbh;
  __m128i roundah;
  __m128i sumbl;
  __m128i sumbh;
  __m128i sumal;
  __m128i sumah;
  __m128i mul1bl;
  __m128i mul1bh;
  __m128i mul1b_lows;
  __m128i mul1b_highs;
  __m128i mul0bl;
  __m128i mul0bh;
  __m128i mul0b_lows;
  __m128i mul0b_highs;
  __m128i mul1al;
  __m128i mul1ah;
  __m128i mul1a_lows;
  __m128i mul1a_highs;
  __m128i mul0al;
  __m128i mul0ah;
  __m128i mul0a_lows;
  __m128i mul0a_highs;
  __m128i mask1b;
  __m128i mask1a;
  __m128i s1b;
  __m128i s1a;
  __m128i s0b;
  __m128i s0a;
  undefined2 local_488;
  undefined2 uStack_486;
  undefined2 uStack_484;
  undefined2 uStack_482;
  undefined2 uStack_480;
  undefined2 uStack_47e;
  undefined2 uStack_47c;
  undefined2 uStack_47a;
  undefined2 local_478;
  undefined2 uStack_476;
  undefined2 uStack_474;
  undefined2 uStack_472;
  undefined2 uStack_470;
  undefined2 uStack_46e;
  undefined2 uStack_46c;
  undefined2 uStack_46a;
  undefined2 local_468;
  undefined2 uStack_466;
  undefined2 uStack_464;
  undefined2 uStack_462;
  undefined2 uStack_460;
  undefined2 uStack_45e;
  undefined2 uStack_45c;
  undefined2 uStack_45a;
  undefined2 local_458;
  undefined2 uStack_456;
  undefined2 uStack_454;
  undefined2 uStack_452;
  undefined2 uStack_450;
  undefined2 uStack_44e;
  undefined2 uStack_44c;
  undefined2 uStack_44a;
  undefined2 local_448;
  undefined2 uStack_446;
  undefined2 uStack_444;
  undefined2 uStack_442;
  undefined2 uStack_440;
  undefined2 uStack_43e;
  undefined2 uStack_43c;
  undefined2 uStack_43a;
  undefined2 local_428;
  undefined2 uStack_426;
  undefined2 uStack_424;
  undefined2 uStack_422;
  undefined2 uStack_420;
  undefined2 uStack_41e;
  undefined2 uStack_41c;
  undefined2 uStack_41a;
  undefined2 local_418;
  undefined2 uStack_416;
  undefined2 uStack_414;
  undefined2 uStack_412;
  undefined2 uStack_410;
  undefined2 uStack_40e;
  undefined2 uStack_40c;
  undefined2 uStack_40a;
  undefined2 local_408;
  undefined2 uStack_406;
  undefined2 uStack_404;
  undefined2 uStack_402;
  undefined2 uStack_400;
  undefined2 uStack_3fe;
  undefined2 uStack_3fc;
  undefined2 uStack_3fa;
  undefined2 local_3e8;
  undefined2 uStack_3e6;
  undefined2 uStack_3e4;
  undefined2 uStack_3e2;
  undefined2 uStack_3e0;
  undefined2 uStack_3de;
  undefined2 uStack_3dc;
  undefined2 uStack_3da;
  undefined2 local_3d8;
  undefined2 uStack_3d6;
  undefined2 uStack_3d4;
  undefined2 uStack_3d2;
  undefined2 uStack_3d0;
  undefined2 uStack_3ce;
  undefined2 uStack_3cc;
  undefined2 uStack_3ca;
  undefined2 local_3c8;
  undefined2 uStack_3c6;
  undefined2 uStack_3c4;
  undefined2 uStack_3c2;
  undefined2 local_3a8;
  undefined2 uStack_3a6;
  undefined2 uStack_3a4;
  undefined2 uStack_3a2;
  undefined2 local_388;
  undefined2 uStack_386;
  undefined2 uStack_384;
  undefined2 uStack_382;
  undefined2 local_368;
  undefined2 uStack_366;
  undefined2 uStack_364;
  undefined2 uStack_362;
  undefined2 uStack_340;
  undefined2 uStack_33e;
  undefined2 uStack_33c;
  undefined2 uStack_33a;
  undefined2 uStack_320;
  undefined2 uStack_31e;
  undefined2 uStack_31c;
  undefined2 uStack_31a;
  undefined2 uStack_300;
  undefined2 uStack_2fe;
  undefined2 uStack_2fc;
  undefined2 uStack_2fa;
  undefined2 uStack_2e0;
  undefined2 uStack_2de;
  undefined2 uStack_2dc;
  undefined2 uStack_2da;
  undefined4 local_288;
  undefined4 uStack_284;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  undefined4 local_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  undefined4 local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined4 uStack_104;
  undefined4 uStack_fc;
  undefined4 uStack_f4;
  undefined4 uStack_ec;
  undefined4 uStack_e4;
  undefined4 uStack_dc;
  undefined4 uStack_d4;
  undefined4 uStack_cc;
  undefined4 uStack_c4;
  undefined4 uStack_bc;
  undefined4 uStack_b4;
  undefined4 uStack_ac;
  undefined4 uStack_a4;
  undefined4 uStack_9c;
  undefined4 uStack_94;
  undefined4 uStack_8c;
  
  xx_loadu_2x64(in_RDX,(void *)((long)in_RDX + (long)in_ECX * 2));
  xx_loadu_2x64((void *)((long)in_RDX + (long)(in_ECX * 2) * 2),
                (void *)((long)in_RDX + (long)(in_ECX * 3) * 2));
  xx_loadu_2x64(in_R8,(void *)((long)in_R8 + (long)in_R9D * 2));
  lo = (void *)((long)in_R8 + (long)(in_R9D * 3) * 2);
  alVar31 = xx_loadu_2x64((void *)((long)in_R8 + (long)(in_R9D * 2) * 2),lo);
  uVar1 = *(undefined8 *)packa[1];
  uVar2 = *(undefined8 *)(packa[1] + 8);
  uVar3 = *(undefined8 *)clipb[1];
  uVar4 = *(undefined8 *)(clipb[1] + 8);
  local_458 = (short)uVar1;
  uStack_456 = (short)((ulong)uVar1 >> 0x10);
  uStack_454 = (short)((ulong)uVar1 >> 0x20);
  uStack_452 = (short)((ulong)uVar1 >> 0x30);
  uStack_450 = (short)uVar2;
  uStack_44e = (short)((ulong)uVar2 >> 0x10);
  uStack_44c = (short)((ulong)uVar2 >> 0x20);
  uStack_44a = (short)((ulong)uVar2 >> 0x30);
  local_468 = (short)uVar3;
  uStack_466 = (short)((ulong)uVar3 >> 0x10);
  uStack_464 = (short)((ulong)uVar3 >> 0x20);
  uStack_462 = (short)((ulong)uVar3 >> 0x30);
  uStack_460 = (short)uVar4;
  uStack_45e = (short)((ulong)uVar4 >> 0x10);
  uStack_45c = (short)((ulong)uVar4 >> 0x20);
  uStack_45a = (short)((ulong)uVar4 >> 0x30);
  uVar1 = *(undefined8 *)packa[1];
  uVar2 = *(undefined8 *)(packa[1] + 8);
  uVar3 = *(undefined8 *)clipa[0];
  uVar4 = *(undefined8 *)(clipa[0] + 8);
  local_478 = (short)uVar1;
  uStack_476 = (short)((ulong)uVar1 >> 0x10);
  uStack_474 = (short)((ulong)uVar1 >> 0x20);
  uStack_472 = (short)((ulong)uVar1 >> 0x30);
  uStack_470 = (short)uVar2;
  uStack_46e = (short)((ulong)uVar2 >> 0x10);
  uStack_46c = (short)((ulong)uVar2 >> 0x20);
  uStack_46a = (short)((ulong)uVar2 >> 0x30);
  local_488 = (short)uVar3;
  uStack_486 = (short)((ulong)uVar3 >> 0x10);
  uStack_484 = (short)((ulong)uVar3 >> 0x20);
  uStack_482 = (short)((ulong)uVar3 >> 0x30);
  uStack_480 = (short)uVar4;
  uStack_47e = (short)((ulong)uVar4 >> 0x10);
  uStack_47c = (short)((ulong)uVar4 >> 0x20);
  uStack_47a = (short)((ulong)uVar4 >> 0x30);
  auVar26._8_8_ = extraout_XMM0_Qb;
  auVar26._0_8_ = extraout_XMM0_Qa;
  auVar27 = pmulhuw(*(undefined1 (*) [16])clipb[1],auVar26);
  uVar1 = *(undefined8 *)clipb[1];
  uVar2 = *(undefined8 *)(clipb[1] + 8);
  local_3d8 = (short)uVar1;
  uStack_3d6 = (short)((ulong)uVar1 >> 0x10);
  uStack_3d4 = (short)((ulong)uVar1 >> 0x20);
  uStack_3d2 = (short)((ulong)uVar1 >> 0x30);
  uStack_3d0 = (short)uVar2;
  uStack_3ce = (short)((ulong)uVar2 >> 0x10);
  uStack_3cc = (short)((ulong)uVar2 >> 0x20);
  uStack_3ca = (short)((ulong)uVar2 >> 0x30);
  local_3e8 = (short)extraout_XMM0_Qa;
  uStack_3e6 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
  uStack_3e4 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
  uStack_3e2 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
  uStack_3e0 = (short)extraout_XMM0_Qb;
  uStack_3de = (short)((ulong)extraout_XMM0_Qb >> 0x10);
  uStack_3dc = (short)((ulong)extraout_XMM0_Qb >> 0x20);
  uStack_3da = (short)((ulong)extraout_XMM0_Qb >> 0x30);
  uStack_2e0 = auVar27._8_2_;
  uStack_2de = auVar27._10_2_;
  uStack_2dc = auVar27._12_2_;
  uStack_2da = auVar27._14_2_;
  local_368 = auVar27._0_2_;
  uStack_366 = auVar27._2_2_;
  uStack_364 = auVar27._4_2_;
  uStack_362 = auVar27._6_2_;
  auVar25._2_2_ = uStack_456 - uStack_466;
  auVar25._0_2_ = local_458 - local_468;
  auVar25._4_2_ = uStack_454 - uStack_464;
  auVar25._6_2_ = uStack_452 - uStack_462;
  auVar25._10_2_ = uStack_44e - uStack_45e;
  auVar25._8_2_ = uStack_450 - uStack_460;
  auVar25._12_2_ = uStack_44c - uStack_45c;
  auVar25._14_2_ = uStack_44a - uStack_45a;
  auVar24._8_8_ = extraout_XMM0_Qb_01;
  auVar24._0_8_ = extraout_XMM0_Qa_01;
  auVar27 = pmulhuw(auVar25,auVar24);
  local_408 = (short)extraout_XMM0_Qa_01;
  uStack_406 = (short)((ulong)extraout_XMM0_Qa_01 >> 0x10);
  uStack_404 = (short)((ulong)extraout_XMM0_Qa_01 >> 0x20);
  uStack_402 = (short)((ulong)extraout_XMM0_Qa_01 >> 0x30);
  uStack_400 = (short)extraout_XMM0_Qb_01;
  uStack_3fe = (short)((ulong)extraout_XMM0_Qb_01 >> 0x10);
  uStack_3fc = (short)((ulong)extraout_XMM0_Qb_01 >> 0x20);
  uStack_3fa = (short)((ulong)extraout_XMM0_Qb_01 >> 0x30);
  uStack_300 = auVar27._8_2_;
  uStack_2fe = auVar27._10_2_;
  uStack_2fc = auVar27._12_2_;
  uStack_2fa = auVar27._14_2_;
  local_388 = auVar27._0_2_;
  uStack_386 = auVar27._2_2_;
  uStack_384 = auVar27._4_2_;
  uStack_382 = auVar27._6_2_;
  auVar23._8_8_ = extraout_XMM0_Qb_00;
  auVar23._0_8_ = extraout_XMM0_Qa_00;
  auVar27 = pmulhuw(*(undefined1 (*) [16])clipa[0],auVar23);
  uVar1 = *(undefined8 *)clipa[0];
  uVar2 = *(undefined8 *)(clipa[0] + 8);
  local_418 = (short)uVar1;
  uStack_416 = (short)((ulong)uVar1 >> 0x10);
  uStack_414 = (short)((ulong)uVar1 >> 0x20);
  uStack_412 = (short)((ulong)uVar1 >> 0x30);
  uStack_410 = (short)uVar2;
  uStack_40e = (short)((ulong)uVar2 >> 0x10);
  uStack_40c = (short)((ulong)uVar2 >> 0x20);
  uStack_40a = (short)((ulong)uVar2 >> 0x30);
  local_428 = (short)extraout_XMM0_Qa_00;
  uStack_426 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x10);
  uStack_424 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x20);
  uStack_422 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x30);
  uStack_420 = (short)extraout_XMM0_Qb_00;
  uStack_41e = (short)((ulong)extraout_XMM0_Qb_00 >> 0x10);
  uStack_41c = (short)((ulong)extraout_XMM0_Qb_00 >> 0x20);
  uStack_41a = (short)((ulong)extraout_XMM0_Qb_00 >> 0x30);
  uStack_320 = auVar27._8_2_;
  uStack_31e = auVar27._10_2_;
  uStack_31c = auVar27._12_2_;
  uStack_31a = auVar27._14_2_;
  local_3a8 = auVar27._0_2_;
  uStack_3a6 = auVar27._2_2_;
  uStack_3a4 = auVar27._4_2_;
  uStack_3a2 = auVar27._6_2_;
  auVar30._2_2_ = uStack_476 - uStack_486;
  auVar30._0_2_ = local_478 - local_488;
  auVar30._4_2_ = uStack_474 - uStack_484;
  auVar30._6_2_ = uStack_472 - uStack_482;
  auVar30._10_2_ = uStack_46e - uStack_47e;
  auVar30._8_2_ = uStack_470 - uStack_480;
  auVar30._12_2_ = uStack_46c - uStack_47c;
  auVar30._14_2_ = uStack_46a - uStack_47a;
  auVar28._8_8_ = extraout_XMM0_Qb_02;
  auVar28._0_8_ = extraout_XMM0_Qa_02;
  auVar27 = pmulhuw(auVar30,auVar28);
  local_448 = (short)extraout_XMM0_Qa_02;
  uStack_446 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x10);
  uStack_444 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x20);
  uStack_442 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x30);
  uStack_440 = (short)extraout_XMM0_Qb_02;
  uStack_43e = (short)((ulong)extraout_XMM0_Qb_02 >> 0x10);
  uStack_43c = (short)((ulong)extraout_XMM0_Qb_02 >> 0x20);
  uStack_43a = (short)((ulong)extraout_XMM0_Qb_02 >> 0x30);
  uStack_340 = auVar27._8_2_;
  uStack_33e = auVar27._10_2_;
  uStack_33c = auVar27._12_2_;
  uStack_33a = auVar27._14_2_;
  local_3c8 = auVar27._0_2_;
  uStack_3c6 = auVar27._2_2_;
  uStack_3c4 = auVar27._4_2_;
  uStack_3c2 = auVar27._6_2_;
  iVar19 = CONCAT22(uStack_2e0,uStack_3d0 * uStack_3e0);
  iVar20 = CONCAT22(uStack_2dc,uStack_3cc * uStack_3dc);
  iVar15 = CONCAT22(uStack_300,(uStack_450 - uStack_460) * uStack_400);
  iVar16 = CONCAT22(uStack_2fc,(uStack_44c - uStack_45c) * uStack_3fc);
  uStack_94 = (int)(CONCAT26(uStack_2de,CONCAT24(uStack_3ce * uStack_3de,iVar19)) >> 0x20);
  uStack_8c = (int)(CONCAT26(uStack_2da,CONCAT24(uStack_3ca * uStack_3da,iVar20)) >> 0x20);
  uStack_a4 = (int)(CONCAT26(uStack_2fe,CONCAT24((uStack_44e - uStack_45e) * uStack_3fe,iVar15)) >>
                   0x20);
  uStack_9c = (int)(CONCAT26(uStack_2fa,CONCAT24((uStack_44a - uStack_45a) * uStack_3fa,iVar16)) >>
                   0x20);
  iVar17 = CONCAT22(local_368,local_3d8 * local_3e8);
  iVar18 = CONCAT22(uStack_364,uStack_3d4 * uStack_3e4);
  iVar13 = CONCAT22(local_388,(local_458 - local_468) * local_408);
  iVar14 = CONCAT22(uStack_384,(uStack_454 - uStack_464) * uStack_404);
  uStack_b4 = (int)(CONCAT26(uStack_366,CONCAT24(uStack_3d6 * uStack_3e6,iVar17)) >> 0x20);
  uStack_ac = (int)(CONCAT26(uStack_362,CONCAT24(uStack_3d2 * uStack_3e2,iVar18)) >> 0x20);
  uStack_c4 = (int)(CONCAT26(uStack_386,CONCAT24((uStack_456 - uStack_466) * uStack_406,iVar13)) >>
                   0x20);
  uStack_bc = (int)(CONCAT26(uStack_382,CONCAT24((uStack_452 - uStack_462) * uStack_402,iVar14)) >>
                   0x20);
  iVar11 = CONCAT22(uStack_320,uStack_410 * uStack_420);
  iVar12 = CONCAT22(uStack_31c,uStack_40c * uStack_41c);
  iVar7 = CONCAT22(uStack_340,(uStack_470 - uStack_480) * uStack_440);
  iVar8 = CONCAT22(uStack_33c,(uStack_46c - uStack_47c) * uStack_43c);
  uStack_d4 = (int)(CONCAT26(uStack_31e,CONCAT24(uStack_40e * uStack_41e,iVar11)) >> 0x20);
  uStack_cc = (int)(CONCAT26(uStack_31a,CONCAT24(uStack_40a * uStack_41a,iVar12)) >> 0x20);
  uStack_e4 = (int)(CONCAT26(uStack_33e,CONCAT24((uStack_46e - uStack_47e) * uStack_43e,iVar7)) >>
                   0x20);
  uStack_dc = (int)(CONCAT26(uStack_33a,CONCAT24((uStack_46a - uStack_47a) * uStack_43a,iVar8)) >>
                   0x20);
  iVar9 = CONCAT22(local_3a8,local_418 * local_428);
  iVar10 = CONCAT22(uStack_3a4,uStack_414 * uStack_424);
  iVar5 = CONCAT22(local_3c8,(local_478 - local_488) * local_448);
  iVar6 = CONCAT22(uStack_3c4,(uStack_474 - uStack_484) * uStack_444);
  uStack_f4 = (int)(CONCAT26(uStack_3a6,CONCAT24(uStack_416 * uStack_426,iVar9)) >> 0x20);
  uStack_ec = (int)(CONCAT26(uStack_3a2,CONCAT24(uStack_412 * uStack_422,iVar10)) >> 0x20);
  uStack_104 = (int)(CONCAT26(uStack_3c6,CONCAT24((uStack_476 - uStack_486) * uStack_446,iVar5)) >>
                    0x20);
  uStack_fc = (int)(CONCAT26(uStack_3c2,CONCAT24((uStack_472 - uStack_482) * uStack_442,iVar6)) >>
                   0x20);
  local_228 = (int)*(undefined8 *)clipa[1];
  uStack_224 = (int)((ulong)*(undefined8 *)clipa[1] >> 0x20);
  uStack_220 = (int)*(undefined8 *)(clipa[1] + 8);
  uStack_21c = (int)((ulong)*(undefined8 *)(clipa[1] + 8) >> 0x20);
  auVar27 = ZEXT416((uint)packb[0]);
  local_248 = (int)*(undefined8 *)clipa[1];
  uStack_244 = (int)((ulong)*(undefined8 *)clipa[1] >> 0x20);
  uStack_240 = (int)*(undefined8 *)(clipa[1] + 8);
  uStack_23c = (int)((ulong)*(undefined8 *)(clipa[1] + 8) >> 0x20);
  auVar28 = ZEXT416((uint)packb[0]);
  local_268 = (int)*(undefined8 *)clipa[1];
  uStack_264 = (int)((ulong)*(undefined8 *)clipa[1] >> 0x20);
  uStack_260 = (int)*(undefined8 *)(clipa[1] + 8);
  uStack_25c = (int)((ulong)*(undefined8 *)(clipa[1] + 8) >> 0x20);
  auVar29 = ZEXT416((uint)packb[0]);
  local_288 = (int)*(undefined8 *)clipa[1];
  uStack_284 = (int)((ulong)*(undefined8 *)clipa[1] >> 0x20);
  uStack_280 = (int)*(undefined8 *)(clipa[1] + 8);
  uStack_27c = (int)((ulong)*(undefined8 *)(clipa[1] + 8) >> 0x20);
  auVar30 = ZEXT416((uint)packb[0]);
  auVar22._4_4_ = (uStack_b4 + uStack_c4) - uStack_264 >> auVar29;
  auVar22._0_4_ = (iVar17 + iVar13) - local_268 >> auVar29;
  auVar22._12_4_ = (uStack_ac + uStack_bc) - uStack_25c >> auVar29;
  auVar22._8_4_ = (iVar18 + iVar14) - uStack_260 >> auVar29;
  auVar21._4_4_ = (uStack_94 + uStack_a4) - uStack_224 >> auVar27;
  auVar21._0_4_ = (iVar19 + iVar15) - local_228 >> auVar27;
  auVar21._12_4_ = (uStack_8c + uStack_9c) - uStack_21c >> auVar27;
  auVar21._8_4_ = (iVar20 + iVar16) - uStack_220 >> auVar27;
  packssdw(auVar22,auVar21);
  auVar29._4_4_ = (uStack_f4 + uStack_104) - uStack_284 >> auVar30;
  auVar29._0_4_ = (iVar9 + iVar5) - local_288 >> auVar30;
  auVar29._12_4_ = (uStack_ec + uStack_fc) - uStack_27c >> auVar30;
  auVar29._8_4_ = (iVar10 + iVar6) - uStack_280 >> auVar30;
  auVar27._4_4_ = (uStack_d4 + uStack_e4) - uStack_244 >> auVar28;
  auVar27._0_4_ = (iVar11 + iVar7) - local_248 >> auVar28;
  auVar27._12_4_ = (uStack_cc + uStack_dc) - uStack_23c >> auVar28;
  auVar27._8_4_ = (iVar12 + iVar8) - uStack_240 >> auVar28;
  packssdw(auVar29,auVar27);
  alVar31[0] = (longlong)lo;
  xx_storel_64(in_RDI,alVar31);
  v[1] = extraout_RDX;
  v[0] = (longlong)lo;
  xx_storel_64((void *)((long)in_RDI + (long)in_ESI * 2),v);
  v_00[1] = extraout_RDX_00;
  v_00[0] = (longlong)lo;
  xx_storel_64((void *)((long)in_RDI + (long)(in_ESI * 2) * 2),v_00);
  v_01[1] = extraout_RDX_01;
  v_01[0] = (longlong)lo;
  xx_storel_64((void *)((long)in_RDI + (long)(in_ESI * 3) * 2),v_01);
  return;
}

Assistant:

static inline void highbd_blend_a64_d16_mask_w4_sse4_1(
    uint16_t *dst, int dst_stride, const CONV_BUF_TYPE *src0, int src0_stride,
    const CONV_BUF_TYPE *src1, int src1_stride, const __m128i *mask0a,
    const __m128i *mask0b, const __m128i *round_offset, int shift,
    const __m128i *clip_low, const __m128i *clip_high,
    const __m128i *mask_max) {
  // Load 4 pixels from each of 4 rows from each source
  const __m128i s0a = xx_loadu_2x64(src0, src0 + src0_stride);
  const __m128i s0b =
      xx_loadu_2x64(src0 + 2 * src0_stride, src0 + 3 * src0_stride);
  const __m128i s1a = xx_loadu_2x64(src1, src1 + src1_stride);
  const __m128i s1b =
      xx_loadu_2x64(src1 + 2 * src1_stride, src1 + 3 * src1_stride);

  // Generate the inverse masks
  const __m128i mask1a = _mm_sub_epi16(*mask_max, *mask0a);
  const __m128i mask1b = _mm_sub_epi16(*mask_max, *mask0b);

  // Multiply each mask by the respective source
  const __m128i mul0a_highs = _mm_mulhi_epu16(*mask0a, s0a);
  const __m128i mul0a_lows = _mm_mullo_epi16(*mask0a, s0a);
  const __m128i mul0ah = _mm_unpackhi_epi16(mul0a_lows, mul0a_highs);
  const __m128i mul0al = _mm_unpacklo_epi16(mul0a_lows, mul0a_highs);
  const __m128i mul1a_highs = _mm_mulhi_epu16(mask1a, s1a);
  const __m128i mul1a_lows = _mm_mullo_epi16(mask1a, s1a);
  const __m128i mul1ah = _mm_unpackhi_epi16(mul1a_lows, mul1a_highs);
  const __m128i mul1al = _mm_unpacklo_epi16(mul1a_lows, mul1a_highs);

  const __m128i mul0b_highs = _mm_mulhi_epu16(*mask0b, s0b);
  const __m128i mul0b_lows = _mm_mullo_epi16(*mask0b, s0b);
  const __m128i mul0bh = _mm_unpackhi_epi16(mul0b_lows, mul0b_highs);
  const __m128i mul0bl = _mm_unpacklo_epi16(mul0b_lows, mul0b_highs);
  const __m128i mul1b_highs = _mm_mulhi_epu16(mask1b, s1b);
  const __m128i mul1b_lows = _mm_mullo_epi16(mask1b, s1b);
  const __m128i mul1bh = _mm_unpackhi_epi16(mul1b_lows, mul1b_highs);
  const __m128i mul1bl = _mm_unpacklo_epi16(mul1b_lows, mul1b_highs);

  const __m128i sumah = _mm_add_epi32(mul0ah, mul1ah);
  const __m128i sumal = _mm_add_epi32(mul0al, mul1al);
  const __m128i sumbh = _mm_add_epi32(mul0bh, mul1bh);
  const __m128i sumbl = _mm_add_epi32(mul0bl, mul1bl);

  const __m128i roundah =
      _mm_srai_epi32(_mm_sub_epi32(sumah, *round_offset), shift);
  const __m128i roundbh =
      _mm_srai_epi32(_mm_sub_epi32(sumbh, *round_offset), shift);
  const __m128i roundal =
      _mm_srai_epi32(_mm_sub_epi32(sumal, *round_offset), shift);
  const __m128i roundbl =
      _mm_srai_epi32(_mm_sub_epi32(sumbl, *round_offset), shift);

  const __m128i packa = _mm_packs_epi32(roundal, roundah);
  const __m128i packb = _mm_packs_epi32(roundbl, roundbh);

  const __m128i clipa =
      _mm_min_epi16(_mm_max_epi16(packa, *clip_low), *clip_high);
  const __m128i clipb =
      _mm_min_epi16(_mm_max_epi16(packb, *clip_low), *clip_high);

  xx_storel_64(dst, _mm_srli_si128(clipa, 8));
  xx_storel_64(dst + dst_stride, clipa);
  xx_storel_64(dst + 2 * dst_stride, _mm_srli_si128(clipb, 8));
  xx_storel_64(dst + 3 * dst_stride, clipb);
}